

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O1

uint32_t get32(UNewTrie2 *trie,UChar32 c,UBool fromLSCP)

{
  int iVar1;
  uint32_t *puVar2;
  
  if ((c < trie->highStart) || ((c & 0xfffffc00U) == 0xd800 && fromLSCP == '\0')) {
    if (fromLSCP == '\0' || (c & 0xfffffc00U) != 0xd800) {
      iVar1 = ((uint)c >> 5 & 0x3f) + trie->index1[c >> 0xb];
    }
    else {
      iVar1 = ((uint)c >> 5) + 0x140;
    }
    puVar2 = trie->data + (ulong)(c & 0x1f) + (long)trie->index2[iVar1];
  }
  else {
    puVar2 = trie->data + (long)trie->dataLength + -4;
  }
  return *puVar2;
}

Assistant:

static uint32_t
get32(const UNewTrie2 *trie, UChar32 c, UBool fromLSCP) {
    int32_t i2, block;

    if(c>=trie->highStart && (!U_IS_LEAD(c) || fromLSCP)) {
        return trie->data[trie->dataLength-UTRIE2_DATA_GRANULARITY];
    }

    if(U_IS_LEAD(c) && fromLSCP) {
        i2=(UTRIE2_LSCP_INDEX_2_OFFSET-(0xd800>>UTRIE2_SHIFT_2))+
            (c>>UTRIE2_SHIFT_2);
    } else {
        i2=trie->index1[c>>UTRIE2_SHIFT_1]+
            ((c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK);
    }
    block=trie->index2[i2];
    return trie->data[block+(c&UTRIE2_DATA_MASK)];
}